

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

bool __thiscall pfederc::Parser::skipToEol(Parser *this)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = Token::operator!=(this->lexer->currentToken,TOK_EOL);
    if (!bVar1) break;
    bVar1 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
    if (!bVar1) break;
    Lexer::next(this->lexer);
  }
  bVar1 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
  return bVar1;
}

Assistant:

bool Parser::skipToEol() noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_EOL
      && *lexer.getCurrentToken() != TokenType::TOK_EOF)
    lexer.next();

  return *lexer.getCurrentToken() != TokenType::TOK_EOF;
}